

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::encode_rice(symbol_codec *this,uint v,uint m)

{
  byte bVar1;
  uint num_bits;
  
  bVar1 = (byte)m & 0x1f;
  num_bits = v >> bVar1;
  if (num_bits < 0x11) {
    if (v >> bVar1 == 0) goto LAB_001a2a78;
  }
  else {
    do {
      record_put_bits(this,0xffff,0x10);
      num_bits = num_bits - 0x10;
    } while (0x10 < num_bits);
  }
  encode_bits(this,~(-1 << ((byte)num_bits & 0x1f)),num_bits);
LAB_001a2a78:
  record_put_bits(this,0,1);
  encode_bits(this,~(-1 << ((byte)m & 0x1f)) & v,m);
  return;
}

Assistant:

void symbol_codec::encode_rice(uint v, uint m) {
  CRNLIB_ASSERT(m > 0);

  uint q = v >> m;
  uint r = v & ((1 << m) - 1);

  while (q > 16) {
    encode_bits(0xFFFF, 16);
    q -= 16;
  }

  if (q)
    encode_bits((1 << q) - 1, q);

  encode_bits(0, 1);

  encode_bits(r, m);
}